

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

void __thiscall
glslang::TQualifier::setSpirvDecorateString(TQualifier *this,int decoration,TIntermAggregate *args)

{
  undefined8 *puVar1;
  int iVar2;
  TSpirvDecorate *this_00;
  undefined4 extraout_var;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  *this_01;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  TIntermConstantUnion *extraOperand;
  TVector<const_glslang::TIntermConstantUnion_*> extraOperands;
  int local_54;
  value_type local_50;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  local_48;
  
  local_54 = decoration;
  if (this->spirvDecorate == (TSpirvDecorate *)0x0) {
    this_00 = (TSpirvDecorate *)
              TSpirvDecorate::operator_new
                        ((TSpirvDecorate *)0xa8,CONCAT44(in_register_00000034,decoration));
    TSpirvDecorate::TSpirvDecorate(this_00);
    this->spirvDecorate = this_00;
  }
  if (args != (TIntermAggregate *)0x0) {
    TVector<const_glslang::TIntermConstantUnion_*>::TVector
              ((TVector<const_glslang::TIntermConstantUnion_*> *)&local_48);
    iVar2 = (*(args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(args);
    puVar3 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 8);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 0x10);
    while( true ) {
      if (puVar3 == puVar1) {
        this_01 = &std::
                   map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                   ::operator[](&(this->spirvDecorate->decorateStrings).
                                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                                ,&local_54)->
                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ;
        std::
        vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ::operator=(this_01,&local_48);
        return;
      }
      local_50 = (value_type)(**(code **)(*(long *)*puVar3 + 0x28))();
      if (local_50 == (value_type)0x0) break;
      std::
      vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ::push_back(&local_48,&local_50);
      puVar3 = puVar3 + 1;
    }
    __assert_fail("extraOperand != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                  ,0xc1,
                  "void glslang::TQualifier::setSpirvDecorateString(int, const TIntermAggregate *)")
    ;
  }
  __assert_fail("args",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                ,0xbd,
                "void glslang::TQualifier::setSpirvDecorateString(int, const TIntermAggregate *)");
}

Assistant:

void TQualifier::setSpirvDecorateString(int decoration, const TIntermAggregate* args)
{
    if (!spirvDecorate)
        spirvDecorate = new TSpirvDecorate;

    assert(args);
    TVector<const TIntermConstantUnion*> extraOperands;
    for (auto arg : args->getSequence()) {
        auto extraOperand = arg->getAsConstantUnion();
        assert(extraOperand != nullptr);
        extraOperands.push_back(extraOperand);
    }
    spirvDecorate->decorateStrings[decoration] = extraOperands;
}